

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O1

void __thiscall Deck::Deck(Deck *this,int amountCountries)

{
  int *piVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = amountCountries;
  this->deckSize = piVar1;
  pvVar2 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->deckPointer = pvVar2;
  pvVar2 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->discardPointer = pvVar2;
  return;
}

Assistant:

Deck::Deck(int amountCountries) {
    deckSize = new int(amountCountries); //store value on the heap to avoid losing it
    deckPointer = new std::vector<CardType>;
    discardPointer = new std::vector<CardType>;
}